

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O2

int __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::_copy
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  long lVar1;
  int iVar2;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *pTVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar4;
  
  while( true ) {
    pTVar3 = TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::operator=
                       (&((RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                           *)dst)->element,
                        (TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *)
                        (src + 0x28));
    iVar2 = (int)pTVar3;
    lVar1 = *(long *)(src + 8);
    if (lVar1 != 0) {
      pRVar4 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)operator_new(0x70);
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::RBTreeNode(pRVar4,(TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *)
                          (lVar1 + 0x28));
      pRVar4->_parent =
           (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)dst;
      pRVar4->_is_left = true;
      pRVar4->_is_red = false;
      ((RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)dst)->_left = pRVar4;
      iVar2 = _copy(this,(EVP_PKEY_CTX *)pRVar4,*(EVP_PKEY_CTX **)(src + 8));
    }
    lVar1 = *(long *)(src + 0x10);
    if (lVar1 == 0) break;
    pRVar4 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar4,(TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *)
                        (lVar1 + 0x28));
    pRVar4->_parent =
         (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *)dst;
    pRVar4->_is_left = false;
    pRVar4->_is_red = false;
    ((RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      *)dst)->_right = pRVar4;
    src = *(EVP_PKEY_CTX **)(src + 0x10);
    dst = (EVP_PKEY_CTX *)pRVar4;
  }
  return iVar2;
}

Assistant:

inline
    void RBTree<Key, Value>::_copy(RBTreeNode<TreeElement<Key, Value>> *node, RBTreeNode<TreeElement<Key, Value>> *node_src) {
        node->element = node_src->element;
        if (node_src->left() != nullptr) {
            node->insertLeft(new RBTreeNode<TreeElement<Key, Value>>(node_src->left()->element));
            _copy(node->left(), node_src->left());
        }
        if (node_src->right() != nullptr) {
            node->insertRight(new RBTreeNode<TreeElement<Key, Value>>(node_src->right()->element));
            _copy(node->right(), node_src->right());
        }
    }